

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O1

void MercuryJson::__error_maybe_escape(char *context,size_t *length,char ch)

{
  size_t sVar1;
  
  if (ch == '\0') {
    sVar1 = *length;
    *length = sVar1 + 1;
    context[sVar1] = '\"';
    return;
  }
  sVar1 = *length;
  *length = sVar1 + 1;
  if ((byte)(ch - 8U) < 3) {
    context[sVar1] = '\\';
    if (ch == '\b') {
      sVar1 = *length;
      *length = sVar1 + 1;
      context[sVar1] = 'b';
      return;
    }
    if (ch == '\n') {
      sVar1 = *length;
      *length = sVar1 + 1;
      context[sVar1] = 'n';
      return;
    }
    if (ch == '\t') {
      sVar1 = *length;
      *length = sVar1 + 1;
      context[sVar1] = 't';
      return;
    }
  }
  else {
    context[sVar1] = ch;
  }
  return;
}

Assistant:

void __error_maybe_escape(char *context, size_t *length, char ch) {
        if (ch == '\0') {
            context[(*length)++] = '"';
        } else if (ch == '\t' || ch == '\n' || ch == '\b') {
            context[(*length)++] = '\\';
            switch (ch) {
                case '\t':
                    context[(*length)++] = 't';
                    break;
                case '\n':
                    context[(*length)++] = 'n';
                    break;
                case '\b':
                    context[(*length)++] = 'b';
                    break;
                default:
                    break;
            }
        } else {
            context[(*length)++] = ch;
        }
    }